

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldblib.c
# Opt level: O0

int db_gethook(lua_State *L)

{
  lua_State *plVar1;
  int iVar2;
  lua_Hook p_Var3;
  char *s;
  lua_Hook hook;
  char local_25;
  int mask;
  lua_State *plStack_20;
  char buff [5];
  lua_State *L1;
  lua_State *plStack_10;
  int arg;
  lua_State *L_local;
  
  plStack_10 = L;
  plStack_20 = getthread(L,(int *)((long)&L1 + 4));
  iVar2 = lua_gethookmask(plStack_20);
  p_Var3 = lua_gethook(plStack_20);
  if (p_Var3 == (lua_Hook)0x0) {
    lua_pushnil(plStack_10);
  }
  else if (p_Var3 == hookf) {
    lua_rawgetp(plStack_10,-0xf4628,&HOOKKEY);
    checkstack(plStack_10,plStack_20,1);
    lua_pushthread(plStack_20);
    lua_xmove(plStack_20,plStack_10,1);
    lua_rawget(plStack_10,-2);
    lua_rotate(plStack_10,-2,-1);
    lua_settop(plStack_10,-2);
  }
  else {
    lua_pushstring(plStack_10,"external hook");
  }
  plVar1 = plStack_10;
  s = unmakemask(iVar2,&local_25);
  lua_pushstring(plVar1,s);
  plVar1 = plStack_10;
  iVar2 = lua_gethookcount(plStack_20);
  lua_pushinteger(plVar1,(long)iVar2);
  return 3;
}

Assistant:

static int db_gethook (lua_State *L) {
  int arg;
  lua_State *L1 = getthread(L, &arg);
  char buff[5];
  int mask = lua_gethookmask(L1);
  lua_Hook hook = lua_gethook(L1);
  if (hook == NULL)  /* no hook? */
    lua_pushnil(L);
  else if (hook != hookf)  /* external hook? */
    lua_pushliteral(L, "external hook");
  else {  /* hook table must exist */
    lua_rawgetp(L, LUA_REGISTRYINDEX, &HOOKKEY);
    checkstack(L, L1, 1);
    lua_pushthread(L1); lua_xmove(L1, L, 1);
    lua_rawget(L, -2);   /* 1st result = hooktable[L1] */
    lua_remove(L, -2);  /* remove hook table */
  }
  lua_pushstring(L, unmakemask(mask, buff));  /* 2nd result = mask */
  lua_pushinteger(L, lua_gethookcount(L1));  /* 3rd result = count */
  return 3;
}